

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotBuffer.cpp
# Opt level: O2

uchar * __thiscall cali::SnapshotBuffer::reserve(SnapshotBuffer *this,size_t min)

{
  ulong uVar1;
  uchar *__src;
  uchar *__dest;
  
  if (this->m_reserved_len < min) {
    uVar1 = min * 2 + 0x1000;
    this->m_reserved_len = uVar1;
    __dest = (uchar *)operator_new__(uVar1);
    __src = this->m_buffer;
    memcpy(__dest,__src,this->m_pos);
    if (__src != (uchar *)0x0) {
      operator_delete__(__src);
    }
    this->m_buffer = __dest;
  }
  else {
    __dest = this->m_buffer;
  }
  return __dest;
}

Assistant:

unsigned char* SnapshotBuffer::reserve(size_t min)
{
    if (min <= m_reserved_len)
        return m_buffer;

    m_reserved_len = 4096 + min * 2;

    unsigned char* tmp = new unsigned char[m_reserved_len];
    memcpy(tmp, m_buffer, m_pos);
    delete[] m_buffer;
    m_buffer = tmp;

    return m_buffer;
}